

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::CreateRel
          (Relation *this,string *schema_name,string *table_name,bool temporary,
          OnCreateConflict on_conflict)

{
  undefined8 uVar1;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  OnCreateConflict local_59;
  undefined1 local_58 [40];
  
  local_59 = on_conflict;
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)local_58);
  make_shared_ptr<duckdb::CreateTableRelation,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,duckdb::OnCreateConflict&>
            ((shared_ptr<duckdb::Relation,_true> *)(local_58 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             table_name,(bool *)CONCAT71(in_register_00000009,temporary),&local_59);
  uVar1 = local_58._24_8_;
  local_58._24_8_ = 0;
  this->_vptr_Relation = (_func_int **)local_58._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar1;
  local_58._16_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::CreateRel(const string &schema_name, const string &table_name, bool temporary,
                                         OnCreateConflict on_conflict) {
	return make_shared_ptr<CreateTableRelation>(shared_from_this(), schema_name, table_name, temporary, on_conflict);
}